

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_transform_base.h
# Opt level: O0

bool __thiscall
draco::PredictionSchemeWrapTransformBase<int>::InitCorrectionBounds
          (PredictionSchemeWrapTransformBase<int> *this)

{
  int iVar1;
  long lVar2;
  long in_RDI;
  int64_t dif;
  
  lVar2 = (long)*(int *)(in_RDI + 8) - (long)*(int *)(in_RDI + 4);
  if ((-1 < lVar2) && (iVar1 = std::numeric_limits<int>::max(), lVar2 < iVar1)) {
    *(int *)(in_RDI + 0xc) = (int)lVar2 + 1;
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0xc) / 2;
    *(int *)(in_RDI + 0x14) = -*(int *)(in_RDI + 0x10);
    if ((*(uint *)(in_RDI + 0xc) & 1) == 0) {
      *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + -1;
    }
    return true;
  }
  return false;
}

Assistant:

bool InitCorrectionBounds() {
    const int64_t dif =
        static_cast<int64_t>(max_value_) - static_cast<int64_t>(min_value_);
    if (dif < 0 || dif >= std::numeric_limits<DataTypeT>::max()) {
      return false;
    }
    max_dif_ = 1 + static_cast<DataTypeT>(dif);
    max_correction_ = max_dif_ / 2;
    min_correction_ = -max_correction_;
    if ((max_dif_ & 1) == 0) {
      max_correction_ -= 1;
    }
    return true;
  }